

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

Pos getSpawn(Generator *g)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Pos PVar5;
  int x;
  int iVar6;
  int iVar7;
  long lVar8;
  int tmp_1;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  int grass;
  int tmp;
  uint uStack_4c74;
  ulong local_4c70;
  ulong local_4c68;
  ulong local_4c60;
  ulong local_4c58;
  ulong local_4c50;
  ulong local_4c48;
  ulong local_4c40;
  Generator *local_4c38;
  uint64_t rng;
  int id;
  float y;
  SurfaceNoise sn;
  
  PVar5 = estimateSpawn(g,&rng);
  uVar12 = (ulong)PVar5 >> 0x20;
  if (1 < g->mc) {
    initSurfaceNoise(&sn,0,g->seed);
    local_4c38 = g;
    if (g->mc < 0x10) {
      iVar6 = 1000;
      while (bVar16 = iVar6 != 0, iVar6 = iVar6 + -1, bVar16) {
        grass = 0;
        iVar7 = PVar5.x;
        mapApproxHeight(&y,&id,local_4c38,&sn,iVar7 >> 2,(int)uVar12 >> 2,1,1);
        getBiomeDepthAndScale(id,(double *)0x0,(double *)0x0,&grass);
        if ((0 < grass) && ((float)grass <= y)) break;
        iVar1 = nextInt(&rng,0x40);
        iVar2 = nextInt(&rng,0x40);
        iVar3 = nextInt(&rng,0x40);
        iVar4 = nextInt(&rng,0x40);
        uVar12 = (ulong)(uint)((iVar3 + (int)uVar12) - iVar4);
        PVar5.z = 0;
        PVar5.x = (iVar1 + iVar7) - iVar2;
      }
    }
    else {
      if ((uint)g->mc < 0x16) {
        uVar12 = (ulong)(PVar5.x & 0xfffffff0);
        uVar13 = (ulong)(PVar5.z & 0xfffffff0);
        iVar6 = -1;
        local_4c48 = 0;
        _tmp = (ulong)uStack_4c74 << 0x20;
        local_4c58 = 0;
        iVar7 = 0;
        local_4c70 = uVar13;
        local_4c68 = uVar12;
        while( true ) {
          uVar11 = (uint)uVar13;
          uVar9 = (uint)uVar12;
          if (iVar7 == 0x400) break;
          if (((int)local_4c58 + 0xfU < 0x20) && ((int)local_4c48 + 0xfU < 0x20)) {
            local_4c60 = CONCAT44(local_4c60._4_4_,iVar7);
            local_4c50 = CONCAT44(local_4c50._4_4_,iVar6);
            uVar9 = (int)local_4c58 * 0x10 + uVar9;
            local_4c40 = (ulong)uVar9;
            iVar6 = (int)local_4c48 * 0x10 + uVar11;
            mapApproxHeight(&y,&id,g,&sn,(int)uVar9 >> 2,iVar6 >> 2,4,4);
            lVar8 = 0;
            for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
              lVar15 = lVar8;
              for (lVar10 = 0; lVar10 != -0x10; lVar10 = lVar10 + -4) {
                grass = 0;
                getBiomeDepthAndScale
                          (*(int *)((long)&id + lVar15),(double *)0x0,(double *)0x0,&grass);
                if ((0 < grass) &&
                   ((float)grass < *(float *)((long)&y + lVar15) ||
                    (float)grass == *(float *)((long)&y + lVar15))) {
                  PVar5.x = (int)local_4c40 + (int)lVar14 * 4;
                  PVar5.z = 0;
                  uVar12 = (ulong)(uint)(iVar6 - (int)lVar10);
                  goto LAB_00108445;
                }
                lVar15 = lVar15 + 0x10;
              }
              lVar8 = lVar8 + 4;
              g = local_4c38;
            }
            uVar12 = local_4c68;
            uVar13 = local_4c70;
            iVar7 = (int)local_4c60;
            iVar6 = (int)local_4c50;
          }
          iVar2 = (int)local_4c58;
          iVar1 = (int)local_4c48;
          if (((iVar2 == iVar1) || ((iVar2 < 0 && (iVar2 == -iVar1)))) ||
             ((iVar3 = tmp, 0 < iVar2 && (iVar2 == 1 - iVar1)))) {
            iVar3 = -iVar6;
            iVar6 = tmp;
          }
          local_4c58 = (ulong)(uint)(iVar2 + iVar3);
          local_4c48 = (ulong)(uint)(iVar1 + iVar6);
          iVar7 = iVar7 + 1;
          _tmp = CONCAT44(uStack_4c74,iVar3);
        }
      }
      else {
        iVar6 = -1;
        local_4c40 = 0;
        iVar1 = 0;
        local_4c50 = 0;
        iVar7 = 0;
        local_4c70 = uVar12;
        while( true ) {
          if (iVar7 == 0x79) break;
          if (((int)local_4c50 + 5U < 0xb) && ((int)local_4c40 + 5U < 0xb)) {
            local_4c68 = CONCAT44(local_4c68._4_4_,iVar7);
            local_4c60 = (ulong)((int)local_4c50 * 0x10 + (PVar5.x & 0xfffffff0U));
            iVar7 = (int)local_4c40 * 0x10 + ((uint)local_4c70 & 0xfffffff0);
            local_4c48 = CONCAT44(local_4c48._4_4_,iVar6);
            local_4c58 = CONCAT44(local_4c58._4_4_,iVar1);
            uVar9 = 0;
            while (_tmp = (ulong)uVar9, uVar9 != 4) {
              uVar9 = (int)local_4c60 + uVar9 * 4;
              for (iVar6 = 0; iVar6 != 0x10; iVar6 = iVar6 + 4) {
                uVar11 = iVar7 + iVar6;
                uVar12 = (ulong)uVar11;
                mapApproxHeight(&y,&id,local_4c38,&sn,(int)uVar9 >> 2,(int)uVar11 >> 2,1,1);
                if (63.0 < y) {
                  PVar5.z = 0;
                  PVar5.x = uVar9;
                  uVar12 = (ulong)(uint)(iVar7 + iVar6);
                  goto LAB_00108445;
                }
                if ((0x32 < (uint)id) ||
                   (uVar11 = uVar9, (0x4000000000c00U >> ((ulong)(uint)id & 0x3f) & 1) == 0)) {
                  uVar11 = PVar5.x;
                  uVar12 = local_4c70 & 0xffffffff;
                }
                if (((uint)id < 0x33) && ((0x4000000000c00U >> ((ulong)(uint)id & 0x3f) & 1) != 0))
                {
                  PVar5.z = 0;
                  PVar5.x = uVar11;
                  goto LAB_00108445;
                }
                PVar5.z = 0;
                PVar5.x = uVar11;
                local_4c70 = uVar12;
              }
              iVar1 = (int)local_4c58;
              iVar6 = (int)local_4c48;
              uVar9 = (int)_tmp + 1;
            }
            iVar7 = (int)local_4c68;
          }
          iVar3 = (int)local_4c50;
          iVar2 = (int)local_4c40;
          if (((iVar3 == iVar2) || ((iVar3 < 0 && (iVar3 == -iVar2)))) ||
             ((0 < iVar3 && (iVar3 == 1 - iVar2)))) {
            iVar4 = -iVar6;
            iVar6 = iVar1;
            iVar1 = iVar4;
          }
          local_4c50 = (ulong)(uint)(iVar3 + iVar1);
          local_4c40 = (ulong)(uint)(iVar2 + iVar6);
          iVar7 = iVar7 + 1;
        }
        uVar9 = PVar5.x & 0xfffffff0;
        uVar11 = (uint)local_4c70 & 0xfffffff0;
      }
      PVar5.x = uVar9 | 8;
      PVar5.z = 0;
      uVar12 = (ulong)(uVar11 | 8);
    }
  }
LAB_00108445:
  return (Pos)((ulong)PVar5 & 0xffffffff | uVar12 << 0x20);
}

Assistant:

Pos getSpawn(const Generator *g)
{
    uint64_t rng;
    Pos spawn = estimateSpawn(g, &rng);
    int i, j, k, u, v, cx0, cz0;
    uint32_t ii, jj;

    if (g->mc <= MC_B1_7)
        return spawn;

    SurfaceNoise sn;
    initSurfaceNoise(&sn, DIM_OVERWORLD, g->seed);

    if (g->mc <= MC_1_12)
    {
        for (i = 0; i < 1000; i++)
        {
            float y;
            int id, grass = 0;
            mapApproxHeight(&y, &id, g, &sn, spawn.x >> 2, spawn.z >> 2, 1, 1);
            getBiomeDepthAndScale(id, 0, 0, &grass);
            if (grass > 0 && y >= grass)
                break;
            spawn.x += nextInt(&rng, 64) - nextInt(&rng, 64);
            spawn.z += nextInt(&rng, 64) - nextInt(&rng, 64);
        }
    }
    else if (g->mc <= MC_1_17)
    {
        j = k = u = 0;
        v = -1;
        for (i = 0; i < 1024; i++)
        {
            if (j > -16 && j <= 16 && k > -16 && k <= 16)
            {
                // find server spawn point in chunk
                float y[16];
                int ids[16];
                cx0 = (spawn.x & ~15) + j * 16; // start of chunk
                cz0 = (spawn.z & ~15) + k * 16;
                mapApproxHeight(y, ids, g, &sn, cx0 >> 2, cz0 >> 2, 4, 4);
                for (ii = 0; ii < 4; ii++)
                {
                    for (jj = 0; jj < 4; jj++)
                    {
                        int grass = 0;
                        getBiomeDepthAndScale(ids[jj*4+ii], 0, 0, &grass);
                        if (grass <= 0 || y[jj*4+ii] < grass)
                            continue;
                        spawn.x = cx0 + ii * 4;
                        spawn.z = cz0 + jj * 4;
                        return spawn;
                    }
                }
            }
            if (j == k || (j < 0 && j == -k) || (j > 0 && j == 1 - k))
            {
                int tmp = u;
                u = -v;
                v = tmp;
            }
            j += u;
            k += v;
        }
        // chunk center
        spawn.x = (spawn.x & ~15) + 8;
        spawn.z = (spawn.z & ~15) + 8;
    }
    else
    {
        j = k = u = 0;
        v = -1;
        for (i = 0; i < 121; i++)
        {
            if (j >= -5 && j <= 5 && k >= -5 && k <= 5)
            {
                // find server spawn point in chunk
                cx0 = (spawn.x & ~15) + j * 16;
                cz0 = (spawn.z & ~15) + k * 16;
                for (ii = 0; ii < 4; ii++)
                {
                    for (jj = 0; jj < 4; jj++)
                    {
                        float y;
                        int id;
                        int x = cx0 + ii * 4;
                        int z = cz0 + jj * 4;
                        mapApproxHeight(&y, &id, g, &sn, x >> 2, z >> 2, 1, 1);
                        if (y > 63 || id == frozen_ocean ||
                            id == deep_frozen_ocean || id == frozen_river)
                        {
                            spawn.x = x;
                            spawn.z = z;
                            return spawn;
                        }
                    }
                }
            }
            if (j == k || (j < 0 && j == -k) || (j > 0 && j == 1 - k))
            {
                int tmp = u;
                u = -v;
                v = tmp;
            }
            j += u;
            k += v;
        }
        // chunk center
        spawn.x = (spawn.x & ~15) + 8;
        spawn.z = (spawn.z & ~15) + 8;
    }

    return spawn;
}